

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_65a7::Main_getInstance_Test::TestBody(Main_getInstance_Test *this)

{
  char *message;
  AssertHelper local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertionResult gtest_ar;
  Main *instance;
  
  instance = Main::getInstance();
  testing::internal::CmpHelperEQ<Main*,Main*>
            ((internal *)&gtest_ar,"instance","Main::instance",&instance,&Main::instance);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/DanRuta[P]webassembly-workflow/test/cpp-tests.cpp"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(Main, getInstance) {
        Main* instance = Main::getInstance();
        EXPECT_EQ(instance, Main::instance);
    }